

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLScanner::scanReset(XMLScanner *this,XMLPScanToken *token)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 in_EAX;
  RuntimeException *this_00;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  
  uVar1 = this->fScannerId;
  uVar2 = this->fSequenceId;
  iVar4 = -(uint)((int)*(undefined8 *)token == uVar1);
  iVar5 = -(uint)((int)((ulong)*(undefined8 *)token >> 0x20) == uVar2);
  auVar3._4_4_ = iVar4;
  auVar3._0_4_ = iVar4;
  auVar3._8_4_ = iVar5;
  auVar3._12_4_ = iVar5;
  iVar4 = movmskpd(in_EAX,auVar3);
  if (iVar4 == 3) {
    ReaderMgr::reset(&this->fReaderMgr);
    this->fSequenceId = this->fSequenceId + 1;
    this->fErrorCount = 0;
    return;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLScanner.cpp"
             ,0x27f,Scan_BadPScanToken,this->fMemoryManager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
}

Assistant:

void XMLScanner::scanReset(XMLPScanToken& token)
{
    // Make sure this token is still legal
    if (!isLegalToken(token))
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_BadPScanToken, fMemoryManager);

    // Reset the reader manager
    fReaderMgr.reset();

    // And invalidate any tokens by bumping our sequence number
    fSequenceId++;

    // Reset our error count
    fErrorCount = 0;
}